

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void Imf_3_3::anon_unknown_0::composite_line
               (int y,int start,Data *_Data,
               vector<const_char_*,_std::allocator<const_char_*>_> *names,
               vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
               *pointers,vector<unsigned_int,_std::allocator<unsigned_int>_> *total_sizes,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *num_sources)

{
  value_type vVar1;
  uint uVar2;
  value_type pfVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  size_type sVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference ppfVar10;
  reference ppfVar11;
  reference pvVar12;
  reference ppcVar13;
  const_reference pvVar14;
  reference pvVar15;
  Slice *pSVar16;
  long lVar17;
  allocator_type *paVar18;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *in_R8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000008;
  half *ptr_1;
  float *ptr;
  intptr_t base;
  float value;
  Iterator it;
  size_t channel_number;
  size_t channel_1;
  size_t channel;
  int x;
  int pixel;
  DeepCompositing *comp;
  DeepCompositing d;
  vector<const_float_*,_std::allocator<const_float_*>_> inputs;
  vector<float,_std::allocator<float>_> output_pixel;
  value_type vVar19;
  float in_stack_fffffffffffffddc;
  ConstIterator *in_stack_fffffffffffffde0;
  allocator_type *in_stack_fffffffffffffdf0;
  size_type in_stack_fffffffffffffdf8;
  vector<const_float_*,_std::allocator<const_float_*>_> *in_stack_fffffffffffffe00;
  DeepCompositing *local_120;
  undefined2 local_ea;
  size_type local_a8;
  ulong local_a0;
  ulong local_98;
  int local_90;
  int local_8c;
  DeepCompositing local_80 [2];
  vector<const_float_*,_std::allocator<const_float_*>_> local_70 [2];
  vector<float,_std::allocator<float>_> local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *local_20;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RCX);
  std::allocator<float>::allocator((allocator<float> *)0x1d3917);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8,(allocator_type *)in_stack_fffffffffffffdf0);
  std::allocator<float>::~allocator((allocator<float> *)0x1d3943);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::size(local_18);
  std::allocator<const_float_*>::allocator((allocator<const_float_*> *)0x1d396d);
  std::vector<const_float_*,_std::allocator<const_float_*>_>::vector
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::allocator<const_float_*>::~allocator((allocator<const_float_*> *)0x1d3999);
  DeepCompositing::DeepCompositing(local_80);
  if (*(long *)(local_10 + 0xa8) == 0) {
    local_120 = local_80;
  }
  else {
    local_120 = *(DeepCompositing **)(local_10 + 0xa8);
  }
  local_8c = (local_4 - local_8) * ((*(int *)(local_10 + 0xa0) + 1) - *(int *)(local_10 + 0x98));
  for (local_90 = *(int *)(local_10 + 0x98); local_90 <= *(int *)(local_10 + 0xa0);
      local_90 = local_90 + 1) {
    if ((*(byte *)(local_10 + 0x60) & 1) == 0) {
      pvVar8 = std::
               vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
               ::operator[](local_20,0);
      pvVar9 = std::
               vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
               ::operator[](pvVar8,0);
      ppfVar10 = std::vector<float_*,_std::allocator<float_*>_>::operator[](pvVar9,(long)local_8c);
      pfVar3 = *ppfVar10;
      ppfVar11 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[](local_70,0);
      *ppfVar11 = pfVar3;
      pvVar8 = std::
               vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
               ::operator[](local_20,0);
      pvVar9 = std::
               vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
               ::operator[](pvVar8,0);
      ppfVar10 = std::vector<float_*,_std::allocator<float_*>_>::operator[](pvVar9,(long)local_8c);
      pfVar3 = *ppfVar10;
      ppfVar11 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[](local_70,1);
      *ppfVar11 = pfVar3;
      for (local_a0 = 2;
          sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(local_18),
          local_a0 < sVar7; local_a0 = local_a0 + 1) {
        pvVar8 = std::
                 vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                 ::operator[](local_20,0);
        pvVar9 = std::
                 vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                 ::operator[](pvVar8,local_a0);
        ppfVar10 = std::vector<float_*,_std::allocator<float_*>_>::operator[](pvVar9,(long)local_8c)
        ;
        pfVar3 = *ppfVar10;
        ppfVar11 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[]
                             (local_70,local_a0);
        *ppfVar11 = pfVar3;
      }
    }
    else {
      for (local_98 = 0;
          sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(local_18),
          local_98 < sVar7; local_98 = local_98 + 1) {
        pvVar8 = std::
                 vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                 ::operator[](local_20,0);
        pvVar9 = std::
                 vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                 ::operator[](pvVar8,local_98);
        ppfVar10 = std::vector<float_*,_std::allocator<float_*>_>::operator[](pvVar9,(long)local_8c)
        ;
        pfVar3 = *ppfVar10;
        ppfVar11 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[]
                             (local_70,local_98);
        *ppfVar11 = pfVar3;
      }
    }
    pvVar12 = std::vector<float,_std::allocator<float>_>::operator[](&local_40,0);
    ppfVar11 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[](local_70,0);
    ppcVar13 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](local_18,0);
    sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(local_18);
    pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (local_28,(long)local_8c);
    uVar2 = *pvVar14;
    pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (in_stack_00000008,(long)local_8c);
    vVar19 = *pvVar14;
    (*local_120->_vptr_DeepCompositing[2])
              (local_120,pvVar12,ppfVar11,ppcVar13,sVar7 & 0xffffffff,(ulong)uVar2);
    local_a8 = 0;
    FrameBuffer::begin((FrameBuffer *)CONCAT44(in_stack_fffffffffffffddc,vVar19));
    while( true ) {
      FrameBuffer::ConstIterator::ConstIterator
                (in_stack_fffffffffffffde0,(Iterator *)CONCAT44(in_stack_fffffffffffffddc,vVar19));
      FrameBuffer::end((FrameBuffer *)CONCAT44(in_stack_fffffffffffffddc,vVar19));
      FrameBuffer::ConstIterator::ConstIterator
                (in_stack_fffffffffffffde0,(Iterator *)CONCAT44(in_stack_fffffffffffffddc,vVar19));
      bVar6 = Imf_3_3::operator!=(in_stack_fffffffffffffde0,
                                  (ConstIterator *)CONCAT44(in_stack_fffffffffffffddc,vVar19));
      if (!bVar6) break;
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(local_10 + 200),local_a8);
      pvVar12 = std::vector<float,_std::allocator<float>_>::operator[](&local_40,(long)*pvVar15);
      vVar1 = *pvVar12;
      pSVar16 = FrameBuffer::Iterator::slice((Iterator *)0x1d3edd);
      pcVar4 = pSVar16->base;
      pSVar16 = FrameBuffer::Iterator::slice((Iterator *)0x1d3f08);
      if (pSVar16->type == FLOAT) {
        lVar17 = (long)local_4;
        pSVar16 = FrameBuffer::Iterator::slice((Iterator *)0x1d3f4a);
        sVar5 = pSVar16->yStride;
        pSVar16 = FrameBuffer::Iterator::slice((Iterator *)0x1d3f8a);
        *(value_type *)(pcVar4 + (long)local_90 * pSVar16->xStride + lVar17 * sVar5) = vVar1;
      }
      else {
        pSVar16 = FrameBuffer::Iterator::slice((Iterator *)0x1d3ffd);
        if (pSVar16->type == HALF) {
          lVar17 = (long)local_4;
          pSVar16 = FrameBuffer::Iterator::slice((Iterator *)0x1d4039);
          in_stack_fffffffffffffdf0 = (allocator_type *)(pcVar4 + lVar17 * pSVar16->yStride);
          lVar17 = (long)local_90;
          pSVar16 = FrameBuffer::Iterator::slice((Iterator *)0x1d4079);
          paVar18 = in_stack_fffffffffffffdf0 + lVar17 * pSVar16->xStride;
          Imath_3_1::half::half((half *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          *(undefined2 *)paVar18 = local_ea;
        }
      }
      local_a8 = local_a8 + 1;
      FrameBuffer::Iterator::operator++((Iterator *)CONCAT44(in_stack_fffffffffffffddc,vVar19),0);
    }
    local_8c = local_8c + 1;
  }
  DeepCompositing::~DeepCompositing(local_80);
  std::vector<const_float_*,_std::allocator<const_float_*>_>::~vector
            ((vector<const_float_*,_std::allocator<const_float_*>_> *)in_stack_fffffffffffffdf0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdf0);
  return;
}

Assistant:

void
composite_line (
    int                                   y,
    int                                   start,
    CompositeDeepScanLine::Data*          _Data,
    vector<const char*>&                  names,
    const vector<vector<vector<float*>>>& pointers,
    const vector<unsigned int>&           total_sizes,
    const vector<unsigned int>&           num_sources)
{
    vector<float> output_pixel (names.size ()); //the pixel we'll output to
    vector<const float*> inputs (names.size ());
    DeepCompositing      d; // fallback compositing engine
    DeepCompositing*     comp = _Data->_comp ? _Data->_comp : &d;

    int pixel =
        (y - start) * (_Data->_dataWindow.max.x + 1 - _Data->_dataWindow.min.x);

    for (int x = _Data->_dataWindow.min.x; x <= _Data->_dataWindow.max.x; x++)
    {
        // set inputs[] to point to the first sample of the first part of each channel
        // if there's a zback, set all channel independently...

        if (_Data->_zback)
        {

            for (size_t channel = 0; channel < names.size (); channel++)
            {
                inputs[channel] = pointers[0][channel][pixel];
            }
        }
        else
        {

            // otherwise, set 0 and 1 to point to Z

            inputs[0] = pointers[0][0][pixel];
            inputs[1] = pointers[0][0][pixel];
            for (size_t channel = 2; channel < names.size (); channel++)
            {
                inputs[channel] = pointers[0][channel][pixel];
            }
        }
        comp->composite_pixel (
            &output_pixel[0],
            &inputs[0],
            &names[0],
            static_cast<int> (names.size ()),
            total_sizes[pixel],
            num_sources[pixel]);

        size_t channel_number = 0;

        //
        // write out composited value into internal frame buffer
        //
        for (FrameBuffer::Iterator it = _Data->_outputFrameBuffer.begin ();
             it != _Data->_outputFrameBuffer.end ();
             it++)
        {

            float value = output_pixel
                [_Data->_bufferMap[channel_number]]; // value to write
            intptr_t base = reinterpret_cast<intptr_t> (it.slice ().base);

            // cast to half float if necessary
            if (it.slice ().type == OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
            {
                float* ptr = reinterpret_cast<float*> (
                    base + y * it.slice ().yStride + x * it.slice ().xStride);
                *ptr = value;
            }
            else if (it.slice ().type == HALF)
            {
                half* ptr = reinterpret_cast<half*> (
                    base + y * it.slice ().yStride + x * it.slice ().xStride);
                *ptr = half (value);
            }

            channel_number++;
        }

        pixel++;

    } // next pixel on row
}